

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O3

vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
* __thiscall
t_enum::f_define(vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                 *__return_storage_ptr__,t_enum *this)

{
  t_object *ptVar1;
  t_object *local_70;
  t_enum *local_68;
  vector<xemmai::t_root,_std::allocator<xemmai::t_root>_> local_60;
  pointer ppStack_48;
  pointer local_40;
  pointer ppStack_38;
  t_value<xemmai::t_pointer> local_30;
  
  local_60.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  ppStack_38 = (pointer)0x0;
  local_68 = this;
  ptVar1 = xemmai::t_enum_of<t_number,t_enum>::
           f_define<xemmai::t_type_of<t_number>::f_define(t_enum*)::_lambda(auto:1)_1_>(this);
  local_70 = (t_object *)xemmai::t_symbol::f_instantiate(6,L"Number");
  local_30.super_t_pointer.v_p = ptVar1;
  std::
  vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>
  ::emplace_back<xemmai::t_object*&,xemmai::t_value<xemmai::t_pointer>>
            ((vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>
              *)&ppStack_48,&local_70,&local_30);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = ppStack_48;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = local_40;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = ppStack_38;
  ppStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  ppStack_38 = (pointer)0x0;
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
             *)&ppStack_48);
  std::vector<xemmai::t_root,_std::allocator<xemmai::t_root>_>::~vector(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<t_root, t_rvalue>> t_enum::f_define()
{
	return t_define(this)
	(L"Number"sv, t_type_of<t_number>::f_define(this))
	;
}